

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstrbuf.cpp
# Opt level: O0

int __thiscall
CVmObjStringBuffer::getp_char_at
          (CVmObjStringBuffer *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  int iVar1;
  vm_strbuf_ext *pvVar2;
  vm_val_t *in_RDX;
  CVmObjStringBuffer *in_RDI;
  int32_t idx;
  CVmNativeCodeDesc *in_stack_ffffffffffffffa8;
  uint *in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb8;
  int iVar3;
  undefined4 in_stack_ffffffffffffffbc;
  int32_t iVar4;
  
  if ((getp_char_at(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') &&
     (iVar1 = __cxa_guard_acquire(&getp_char_at(unsigned_int,vm_val_t*,unsigned_int*)::desc),
     iVar1 != 0)) {
    CVmNativeCodeDesc::CVmNativeCodeDesc(&getp_char_at::desc,1);
    __cxa_guard_release(&getp_char_at(unsigned_int,vm_val_t*,unsigned_int*)::desc);
  }
  iVar1 = CVmObject::get_prop_check_argc
                    ((vm_val_t *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                     in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  if (iVar1 == 0) {
    iVar1 = CVmBif::pop_int_val();
    if (iVar1 < 0) {
      pvVar2 = get_ext(in_RDI);
      iVar4 = pvVar2->len;
    }
    else {
      iVar4 = -1;
    }
    iVar1 = iVar4 + iVar1;
    if ((iVar1 < 0) || (iVar3 = iVar1, pvVar2 = get_ext(in_RDI), pvVar2->len <= iVar3)) {
      err_throw(0);
    }
    pvVar2 = get_ext(in_RDI);
    vm_val_t::set_int(in_RDX,pvVar2->buf[iVar1]);
  }
  return 1;
}

Assistant:

int CVmObjStringBuffer::getp_char_at(VMG_ vm_obj_id_t self,
                                     vm_val_t *retval, uint *argc)
{
    /* check arguments */
    static CVmNativeCodeDesc desc(1);
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* pop the index and adjust to 0-based or end-based */
    int32_t idx = CVmBif::pop_int_val(vmg0_);
    idx += (idx < 0 ? get_ext()->len : -1);

    /* make sure it's in range */
    if (idx < 0 || idx >= (int32_t)get_ext()->len)
        err_throw(VMERR_INDEX_OUT_OF_RANGE);

    /* return the character at the given index, as an integer Unicode code */
    retval->set_int(get_ext()->buf[idx]);

    /* handled */
    return TRUE;
}